

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bit * __thiscall lan::db::find(db *this,string *name,db_bit *ref)

{
  bool bVar1;
  __type _Var2;
  out_of_range *this_00;
  db_bit *pdVar3;
  db *this_01;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  bVar1 = std::operator==(name,"@");
  if (bVar1) {
    pdVar3 = this->anchor;
  }
  else {
    bVar1 = std::operator==(name,"@");
    if (bVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      this_01 = (db *)0x10d0ce;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
      error_string(&local_40,this_01,_empty_anchor_error,&local_60);
      std::out_of_range::out_of_range(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    for (; ref != (db_bit *)0x0; ref = ref->nex) {
      _Var2 = std::operator==(&ref->key,name);
      if (_Var2) {
        return ref;
      }
    }
    pdVar3 = (db_bit *)0x0;
  }
  return pdVar3;
}

Assistant:

lan::db_bit * db::find(const std::string name, lan::db_bit * ref){
            lan::db_bit * buf = ref;
            if(name == "@") return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while (buf) {
                if(buf->key == name) return buf;
                buf = buf->nex;
            } return nullptr;
        }